

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O3

void __thiscall kj::std::anon_unknown_0::TestCase30::run(TestCase30 *this)

{
  long lVar1;
  char buf [7];
  StdInputStream in;
  StdOutputStream out;
  stringstream ss;
  undefined4 local_20f;
  char acStack_20b [2];
  char local_209;
  InputStream local_208;
  stringstream *local_200;
  ArrayOutputStream local_1f8;
  char *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  stringstream local_198 [16];
  uchar local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_198);
  local_208._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_001ba0c8;
  local_1f8.array.ptr = local_188;
  local_1f8.super_BufferedOutputStream.super_OutputStream._vptr_OutputStream =
       (OutputStream)&PTR__ArrayOutputStream_001ba110;
  local_1f8.array.size_ = 0;
  local_1f8.fillPos = (byte *)0x0;
  local_1d8 = "foo";
  local_1d0 = 3;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = "bar";
  local_1b0 = 3;
  local_1a8 = 0;
  uStack_1a0 = 0;
  lVar1 = 8;
  local_200 = local_198;
  do {
    (**(code **)((long)local_1f8.super_BufferedOutputStream.super_OutputStream._vptr_OutputStream +
                0x10))(&local_1f8,*(undefined8 *)((long)&local_1f8.array.ptr + lVar1),
                       *(undefined8 *)((long)&local_1f8.array.size_ + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x58);
  InputStream::read(&local_208,(int)(char (*) [7])&local_20f,(void *)0x6,6);
  local_209 = '\0';
  if ((CONCAT21(acStack_20b,local_20f._3_1_) != 0x726162 || local_20f != 0x626f6f66) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",(char (*) [7])&local_20f);
  }
  ArrayOutputStream::~ArrayOutputStream(&local_1f8);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_208);
  ::std::__cxx11::stringstream::~stringstream(local_198);
  ::std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(StdIoStream, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays
  // are empty.  (This used to not work in some cases.)

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}